

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* bech32::LocateErrors
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
             *__return_storage_ptr__,string *str,CharLimit limit)

{
  char cVar1;
  short sVar2;
  short sVar3;
  ushort uVar4;
  Encoding encoding;
  long lVar5;
  byte bVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_type __res;
  long lVar13;
  const_reference pvVar14;
  const_reference pvVar15;
  const_reference pvVar16;
  ushort *puVar17;
  char *pcVar18;
  char __c;
  pointer piVar19;
  int i_1;
  int iVar20;
  size_type __n;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  size_type sVar26;
  char *__s;
  string *this;
  ulong __n_00;
  uint uVar27;
  int iVar28;
  size_t i;
  size_type sVar29;
  ulong __n_01;
  long in_FS_OFFSET;
  Encoding local_160;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  vector<int,_std::allocator<int>_> possible_errors;
  data values;
  _Vector_base<int,_std::allocator<int>_> local_98;
  Encoding local_80 [2];
  string error_message;
  string hrp;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  sVar26 = str->_M_string_length - limit;
  if (str->_M_string_length < limit || sVar26 == 0) {
    bVar7 = anon_unknown_0::CheckCharacters(str,(vector<int,_std::allocator<int>_> *)&local_98);
    if (!bVar7) {
      hrp._M_dataplus._M_p = "Invalid character or mixed case";
      hrp._M_string_length = (size_type)local_98._M_impl.super__Vector_impl_data._M_start;
      hrp.field_2._M_allocated_capacity =
           (size_type)local_98._M_impl.super__Vector_impl_data._M_finish;
      hrp.field_2._8_8_ = local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                (__return_storage_ptr__,
                 (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)&hrp);
      goto LAB_0035ce88;
    }
    __res = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (str,'1',0xffffffffffffffff);
    if (__res == 0) {
LAB_0035ce22:
      hrp._M_dataplus._M_p._0_4_ = (int)__res;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_98,(int *)&hrp);
      hrp._M_dataplus._M_p = "Invalid separator position";
      hrp._M_string_length = (size_type)local_98._M_impl.super__Vector_impl_data._M_start;
      hrp.field_2._M_allocated_capacity =
           (size_type)local_98._M_impl.super__Vector_impl_data._M_finish;
      hrp.field_2._8_8_ = local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                (__return_storage_ptr__,
                 (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)&hrp);
      goto LAB_0035ce88;
    }
    if (__res != 0xffffffffffffffff) {
      if (__res + 6 < str->_M_string_length) {
        hrp._M_dataplus._M_p = (pointer)&hrp.field_2;
        hrp._M_string_length = 0;
        hrp.field_2._M_allocated_capacity = hrp.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  (&hrp,__res);
        for (sVar29 = 0; __res != sVar29; sVar29 = sVar29 + 1) {
          cVar1 = (str->_M_dataplus)._M_p[sVar29];
          __c = cVar1 + ' ';
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            __c = cVar1;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&hrp,__c);
        }
        sVar26 = ~__res + str->_M_string_length;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&values,sVar26,(allocator_type *)&error_message);
        for (lVar13 = 1; __res + lVar13 < str->_M_string_length; lVar13 = lVar13 + 1) {
          if ((anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[lVar13 + __res]] ==
              0xff) {
            error_message._M_dataplus._M_p._0_4_ = (int)lVar13 + (int)__res;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)&local_98,(int *)&error_message);
            error_message._M_dataplus._M_p = "Invalid Base 32 character";
            error_message._M_string_length =
                 (size_type)local_98._M_impl.super__Vector_impl_data._M_start;
            error_message.field_2._M_allocated_capacity =
                 (size_type)local_98._M_impl.super__Vector_impl_data._M_finish;
            error_message.field_2._8_8_ = local_98._M_impl.super__Vector_impl_data._M_end_of_storage
            ;
            local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
            local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
            local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                      (__return_storage_ptr__,
                       (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)&error_message
                      );
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&error_message._M_string_length);
            goto LAB_0035d556;
          }
          values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13 + -1] =
               (anonymous_namespace)::CHARSET_REV[(byte)(str->_M_dataplus)._M_p[lVar13 + __res]];
        }
        local_80[0] = BECH32;
        local_80[1] = BECH32M;
        bVar7 = false;
        lVar13 = 0;
        do {
          if (lVar13 == 8) {
            pcVar18 = "Invalid Bech32 checksum";
            if (local_160 != BECH32) {
              pcVar18 = "Invalid checksum";
            }
            if (!bVar7) {
              pcVar18 = "Invalid checksum";
            }
            __s = "Invalid Bech32m checksum";
            if (local_160 != BECH32M) {
              __s = pcVar18;
            }
            if (!bVar7) {
              __s = pcVar18;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error_message,__s,(allocator<char> *)&possible_errors);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>,_true>
                      (__return_storage_ptr__,&error_message,
                       (vector<int,_std::allocator<int>_> *)&local_98);
            std::__cxx11::string::~string((string *)&error_message);
            break;
          }
          encoding = *(Encoding *)((long)local_80 + lVar13);
          possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          anon_unknown_0::PreparePolynomialCoefficients(&enc,&hrp,&values);
          uVar8 = anon_unknown_0::PolyMod(&enc);
          uVar9 = anon_unknown_0::EncodingConstant(encoding);
          if (uVar8 == uVar9) {
            error_message._M_dataplus._M_p = "";
            error_message._M_string_length = 0;
            error_message.field_2._M_allocated_capacity = 0;
            error_message.field_2._8_8_ = 0;
            local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                      (__return_storage_ptr__,
                       (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)&error_message
                      );
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&error_message._M_string_length);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
          }
          else {
            uVar27 = ((uVar9 ^ uVar8) & 0x1f) * 0x100401;
            for (__n = 0; __n != 0x19; __n = __n + 1) {
              bVar6 = (byte)__n & 0x1f;
              if (((uVar9 ^ uVar8) >> bVar6 & 0x20) == 0) {
                uVar10 = 0 >> bVar6;
              }
              else {
                pvVar14 = std::array<unsigned_int,_25UL>::at
                                    ((array<unsigned_int,_25UL> *)
                                     (anonymous_namespace)::SYNDROME_CONSTS,__n);
                uVar10 = *pvVar14;
              }
              uVar27 = uVar27 ^ uVar10;
            }
            uVar25 = uVar27 & 0x3ff;
            pvVar15 = std::array<short,_1024UL>::at
                                ((array<short,_1024UL> *)((anonymous_namespace)::tables + 0x7fe),
                                 (ulong)uVar25);
            uVar10 = uVar27 >> 10 & 0x3ff;
            sVar2 = *pvVar15;
            iVar22 = (int)sVar2;
            pvVar15 = std::array<short,_1024UL>::at
                                ((array<short,_1024UL> *)((anonymous_namespace)::tables + 0x7fe),
                                 (ulong)uVar10);
            uVar27 = uVar27 >> 0x14;
            sVar3 = *pvVar15;
            iVar20 = (int)sVar3;
            pvVar15 = std::array<short,_1024UL>::at
                                ((array<short,_1024UL> *)((anonymous_namespace)::tables + 0x7fe),
                                 (ulong)uVar27);
            if ((((sVar2 == -1) || (sVar3 == -1)) || (*pvVar15 == -1)) ||
               (((iVar20 * 2 - (*pvVar15 + iVar22)) + 0x7fe) % 0x3ff != 0)) {
              uVar23 = (ulong)iVar22;
              iVar28 = 0x3ff;
              iVar22 = 1;
              __n_00 = 0;
              uVar21 = (long)iVar20;
              uVar24 = uVar23;
              while( true ) {
                if (sVar26 == __n_00) break;
                if (uVar10 == 0) {
                  uVar11 = 0;
                }
                else {
                  pvVar16 = std::array<short,_1023UL>::at
                                      ((array<short,_1023UL> *)(anonymous_namespace)::tables,
                                       (long)iVar20 + (uVar21 / 0x3ff) * -0x3ff + __n_00);
                  uVar11 = (uint)*pvVar16;
                }
                if (uVar27 != uVar11) {
                  pvVar15 = std::array<short,_1024UL>::at
                                      ((array<short,_1024UL> *)
                                       ((anonymous_namespace)::tables + 0x7fe),
                                       (long)(int)(uVar11 ^ uVar27));
                  sVar2 = *pvVar15;
                  if (uVar25 == 0) {
                    uVar11 = 0;
                  }
                  else {
                    pvVar16 = std::array<short,_1023UL>::at
                                        ((array<short,_1023UL> *)(anonymous_namespace)::tables,
                                         uVar23 + (uVar24 / 0x3ff) * -0x3ff + __n_00);
                    uVar11 = (uint)*pvVar16;
                  }
                  if (uVar10 != uVar11) {
                    pvVar15 = std::array<short,_1024UL>::at
                                        ((array<short,_1024UL> *)
                                         ((anonymous_namespace)::tables + 0x7fe),
                                         (long)(int)(uVar11 ^ uVar10));
                    sVar3 = *pvVar15;
                    uVar11 = (((int)sVar2 - (int)sVar3) + 0x3ff) % 0x3ff;
                    __n_01 = (ulong)(int)uVar11;
                    if (__n_00 != __n_01 && __n_01 < sVar26) {
                      if (uVar25 == 0) {
                        uVar12 = 0;
                      }
                      else {
                        pvVar16 = std::array<short,_1023UL>::at
                                            ((array<short,_1023UL> *)(anonymous_namespace)::tables,
                                             (uVar23 + __n_01) % 0x3ff);
                        uVar12 = (uint)*pvVar16;
                      }
                      if (uVar10 != uVar12) {
                        pvVar15 = std::array<short,_1024UL>::at
                                            ((array<short,_1024UL> *)
                                             ((anonymous_namespace)::tables + 0x7fe),
                                             (long)(int)(uVar12 ^ uVar10));
                        sVar2 = *pvVar15;
                        puVar17 = (ushort *)
                                  std::array<short,_1023UL>::at
                                            ((array<short,_1023UL> *)(anonymous_namespace)::tables,
                                             __n_00);
                        uVar4 = *puVar17;
                        puVar17 = (ushort *)
                                  std::array<short,_1023UL>::at
                                            ((array<short,_1023UL> *)(anonymous_namespace)::tables,
                                             __n_01);
                        pvVar15 = std::array<short,_1024UL>::at
                                            ((array<short,_1024UL> *)
                                             ((anonymous_namespace)::tables + 0x7fe),
                                             (long)(short)(uVar4 ^ *puVar17));
                        if (((int)(((uVar11 * 0x1a + (int)sVar3) - (int)*pvVar15) + 0x3ff) % 0x21 ==
                             0) && ((((int)sVar2 - (int)*pvVar15) + iVar28) % 0x21 == 0)) {
                          if (__n_01 < __n_00) {
                            error_message._M_dataplus._M_p._0_4_ =
                                 (int)str->_M_string_length - iVar22;
                            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                      (&possible_errors,(int *)&error_message);
                            error_message._M_dataplus._M_p._0_4_ =
                                 ~uVar11 + (int)str->_M_string_length;
                            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                      (&possible_errors,(int *)&error_message);
                          }
                          else {
                            error_message._M_dataplus._M_p._0_4_ =
                                 ~uVar11 + (int)str->_M_string_length;
                            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                      (&possible_errors,(int *)&error_message);
                            error_message._M_dataplus._M_p._0_4_ =
                                 (int)str->_M_string_length - iVar22;
                            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                      (&possible_errors,(int *)&error_message);
                          }
                          break;
                        }
                      }
                    }
                  }
                }
                __n_00 = __n_00 + 1;
                iVar22 = iVar22 + 1;
                iVar28 = iVar28 + 0x1a;
                uVar24 = uVar24 + 1;
                uVar21 = uVar21 + 1;
              }
            }
            else {
              uVar27 = ((iVar20 - iVar22) + 0x3ff) % 0x3ff;
              if (((ulong)(long)(int)uVar27 < sVar26) && ((int)(uVar27 * 0x1a + iVar22) % 0x21 == 0)
                 ) {
                error_message._M_dataplus._M_p._0_4_ = ~uVar27 + (int)str->_M_string_length;
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          (&possible_errors,(int *)&error_message);
              }
            }
            if ((local_98._M_impl.super__Vector_impl_data._M_start ==
                 local_98._M_impl.super__Vector_impl_data._M_finish) ||
               ((possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish &&
                ((ulong)((long)possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)possible_errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) <
                 (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_98._M_impl.super__Vector_impl_data._M_start))))) {
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        ((vector<int,_std::allocator<int>_> *)&local_98,&possible_errors);
              if (local_98._M_impl.super__Vector_impl_data._M_start !=
                  local_98._M_impl.super__Vector_impl_data._M_finish) {
                local_160 = encoding;
              }
              bVar7 = (bool)(bVar7 | local_98._M_impl.super__Vector_impl_data._M_start !=
                                     local_98._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&possible_errors.super__Vector_base<int,_std::allocator<int>_>);
          lVar13 = lVar13 + 4;
        } while (uVar8 != uVar9);
LAB_0035d556:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&hrp);
        goto LAB_0035ce90;
      }
      goto LAB_0035ce22;
    }
    hrp._M_dataplus._M_p = "Missing separator";
    hrp._M_string_length = 0;
    hrp.field_2._M_allocated_capacity = 0;
    hrp.field_2._8_8_ = 0;
    error_message._M_dataplus._M_p = (pointer)0x0;
    error_message._M_string_length = 0;
    error_message.field_2._M_allocated_capacity = 0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
              (__return_storage_ptr__,
               (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)&hrp);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&hrp._M_string_length);
    this = &error_message;
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&local_98,sVar26);
    for (piVar19 = local_98._M_impl.super__Vector_impl_data._M_start;
        piVar19 != local_98._M_impl.super__Vector_impl_data._M_finish; piVar19 = piVar19 + 1) {
      *piVar19 = (int)limit;
      limit = (CharLimit)((int)limit + 1);
    }
    hrp._M_dataplus._M_p = "Bech32 string too long";
    hrp._M_string_length = (size_type)local_98._M_impl.super__Vector_impl_data._M_start;
    hrp.field_2._M_allocated_capacity =
         (size_type)local_98._M_impl.super__Vector_impl_data._M_finish;
    hrp.field_2._8_8_ = local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
              (__return_storage_ptr__,
               (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)&hrp);
LAB_0035ce88:
    this = (string *)&hrp._M_string_length;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)this);
LAB_0035ce90:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::vector<int>> LocateErrors(const std::string& str, CharLimit limit) {
    std::vector<int> error_locations{};

    if (str.size() > limit) {
        error_locations.resize(str.size() - limit);
        std::iota(error_locations.begin(), error_locations.end(), static_cast<int>(limit));
        return std::make_pair("Bech32 string too long", std::move(error_locations));
    }

    if (!CheckCharacters(str, error_locations)){
        return std::make_pair("Invalid character or mixed case", std::move(error_locations));
    }

    size_t pos = str.rfind('1');
    if (pos == str.npos) {
        return std::make_pair("Missing separator", std::vector<int>{});
    }
    if (pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        error_locations.push_back(pos);
        return std::make_pair("Invalid separator position", std::move(error_locations));
    }

    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }

    size_t length = str.size() - 1 - pos; // length of data part
    data values(length);
    for (size_t i = pos + 1; i < str.size(); ++i) {
        unsigned char c = str[i];
        int8_t rev = CHARSET_REV[c];
        if (rev == -1) {
            error_locations.push_back(i);
            return std::make_pair("Invalid Base 32 character", std::move(error_locations));
        }
        values[i - pos - 1] = rev;
    }

    // We attempt error detection with both bech32 and bech32m, and choose the one with the fewest errors
    // We can't simply use the segwit version, because that may be one of the errors
    std::optional<Encoding> error_encoding;
    for (Encoding encoding : {Encoding::BECH32, Encoding::BECH32M}) {
        std::vector<int> possible_errors;
        // Recall that (expanded hrp + values) is interpreted as a list of coefficients of a polynomial
        // over GF(32). PolyMod computes the "remainder" of this polynomial modulo the generator G(x).
        auto enc = PreparePolynomialCoefficients(hrp, values);
        uint32_t residue = PolyMod(enc) ^ EncodingConstant(encoding);

        // All valid codewords should be multiples of G(x), so this remainder (after XORing with the encoding
        // constant) should be 0 - hence 0 indicates there are no errors present.
        if (residue != 0) {
            // If errors are present, our polynomial must be of the form C(x) + E(x) where C is the valid
            // codeword (a multiple of G(x)), and E encodes the errors.
            uint32_t syn = Syndrome(residue);

            // Unpack the three 10-bit syndrome values
            int s0 = syn & 0x3FF;
            int s1 = (syn >> 10) & 0x3FF;
            int s2 = syn >> 20;

            // Get the discrete logs of these values in GF1024 for more efficient computation
            int l_s0 = GF1024_LOG.at(s0);
            int l_s1 = GF1024_LOG.at(s1);
            int l_s2 = GF1024_LOG.at(s2);

            // First, suppose there is only a single error. Then E(x) = e1*x^p1 for some position p1
            // Then s0 = E((e)^997) = e1*(e)^(997*p1) and s1 = E((e)^998) = e1*(e)^(998*p1)
            // Therefore s1/s0 = (e)^p1, and by the same logic, s2/s1 = (e)^p1 too.
            // Hence, s1^2 == s0*s2, which is exactly the condition we check first:
            if (l_s0 != -1 && l_s1 != -1 && l_s2 != -1 && (2 * l_s1 - l_s2 - l_s0 + 2046) % 1023 == 0) {
                // Compute the error position p1 as l_s1 - l_s0 = p1 (mod 1023)
                size_t p1 = (l_s1 - l_s0 + 1023) % 1023; // the +1023 ensures it is positive
                // Now because s0 = e1*(e)^(997*p1), we get e1 = s0/((e)^(997*p1)). Remember that (e)^1023 = 1,
                // so 1/((e)^997) = (e)^(1023-997).
                int l_e1 = l_s0 + (1023 - 997) * p1;
                // Finally, some sanity checks on the result:
                // - The error position should be within the length of the data
                // - e1 should be in GF(32), which implies that e1 = (e)^(33k) for some k (the 31 non-zero elements
                // of GF(32) form an index 33 subgroup of the 1023 non-zero elements of GF(1024)).
                if (p1 < length && !(l_e1 % 33)) {
                    // Polynomials run from highest power to lowest, so the index p1 is from the right.
                    // We don't return e1 because it is dangerous to suggest corrections to the user,
                    // the user should check the address themselves.
                    possible_errors.push_back(str.size() - p1 - 1);
                }
            // Otherwise, suppose there are two errors. Then E(x) = e1*x^p1 + e2*x^p2.
            } else {
                // For all possible first error positions p1
                for (size_t p1 = 0; p1 < length; ++p1) {
                    // We have guessed p1, and want to solve for p2. Recall that E(x) = e1*x^p1 + e2*x^p2, so
                    // s0 = E((e)^997) = e1*(e)^(997^p1) + e2*(e)^(997*p2), and similar for s1 and s2.
                    //
                    // Consider s2 + s1*(e)^p1
                    //          = 2e1*(e)^(999^p1) + e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //          = e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //    (Because we are working in characteristic 2.)
                    //          = e2*(e)^(998*p2) ((e)^p2 + (e)^p1)
                    //
                    int s2_s1p1 = s2 ^ (s1 == 0 ? 0 : GF1024_EXP.at((l_s1 + p1) % 1023));
                    if (s2_s1p1 == 0) continue;
                    int l_s2_s1p1 = GF1024_LOG.at(s2_s1p1);

                    // Similarly, s1 + s0*(e)^p1
                    //          = e2*(e)^(997*p2) ((e)^p2 + (e)^p1)
                    int s1_s0p1 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p1) % 1023));
                    if (s1_s0p1 == 0) continue;
                    int l_s1_s0p1 = GF1024_LOG.at(s1_s0p1);

                    // So, putting these together, we can compute the second error position as
                    // (e)^p2 = (s2 + s1^p1)/(s1 + s0^p1)
                    // p2 = log((e)^p2)
                    size_t p2 = (l_s2_s1p1 - l_s1_s0p1 + 1023) % 1023;

                    // Sanity checks that p2 is a valid position and not the same as p1
                    if (p2 >= length || p1 == p2) continue;

                    // Now we want to compute the error values e1 and e2.
                    // Similar to above, we compute s1 + s0*(e)^p2
                    //          = e1*(e)^(997*p1) ((e)^p1 + (e)^p2)
                    int s1_s0p2 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p2) % 1023));
                    if (s1_s0p2 == 0) continue;
                    int l_s1_s0p2 = GF1024_LOG.at(s1_s0p2);

                    // And compute (the log of) 1/((e)^p1 + (e)^p2))
                    int inv_p1_p2 = 1023 - GF1024_LOG.at(GF1024_EXP.at(p1) ^ GF1024_EXP.at(p2));

                    // Then (s1 + s0*(e)^p1) * (1/((e)^p1 + (e)^p2)))
                    //         = e2*(e)^(997*p2)
                    // Then recover e2 by dividing by (e)^(997*p2)
                    int l_e2 = l_s1_s0p1 + inv_p1_p2 + (1023 - 997) * p2;
                    // Check that e2 is in GF(32)
                    if (l_e2 % 33) continue;

                    // In the same way, (s1 + s0*(e)^p2) * (1/((e)^p1 + (e)^p2)))
                    //         = e1*(e)^(997*p1)
                    // So recover e1 by dividing by (e)^(997*p1)
                    int l_e1 = l_s1_s0p2 + inv_p1_p2 + (1023 - 997) * p1;
                    // Check that e1 is in GF(32)
                    if (l_e1 % 33) continue;

                    // Again, we do not return e1 or e2 for safety.
                    // Order the error positions from the left of the string and return them
                    if (p1 > p2) {
                        possible_errors.push_back(str.size() - p1 - 1);
                        possible_errors.push_back(str.size() - p2 - 1);
                    } else {
                        possible_errors.push_back(str.size() - p2 - 1);
                        possible_errors.push_back(str.size() - p1 - 1);
                    }
                    break;
                }
            }
        } else {
            // No errors
            return std::make_pair("", std::vector<int>{});
        }

        if (error_locations.empty() || (!possible_errors.empty() && possible_errors.size() < error_locations.size())) {
            error_locations = std::move(possible_errors);
            if (!error_locations.empty()) error_encoding = encoding;
        }
    }
    std::string error_message = error_encoding == Encoding::BECH32M ? "Invalid Bech32m checksum"
                              : error_encoding == Encoding::BECH32 ? "Invalid Bech32 checksum"
                              : "Invalid checksum";

    return std::make_pair(error_message, std::move(error_locations));
}